

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

void google::protobuf::Join<int_const*>(int *start,int *end,char *delim,string *result)

{
  long lVar1;
  AlphaNum local_60;
  
  for (lVar1 = 0; (int32 *)((long)start + lVar1) != end; lVar1 = lVar1 + 4) {
    if (lVar1 != 0) {
      std::__cxx11::string::append((char *)result);
    }
    strings::AlphaNum::AlphaNum(&local_60,*(int32 *)((long)start + lVar1));
    StrAppend(result,&local_60);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end,
          const char* delim, string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}